

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O2

VariablesArray * __thiscall
bal::VariableTextReader::read_variable_value
          (VariablesArray *__return_storage_ptr__,VariableTextReader *this)

{
  bool bVar1;
  TextReader *this_00;
  variableid_t element_size;
  Container<unsigned_int> value;
  
  bVar1 = TextReader::is_symbol
                    ((TextReader *)
                     ((long)&this->_vptr_VariableTextReader +
                     (long)this->_vptr_VariableTextReader[-3]),'{');
  if (bVar1) {
    TextReader::skip_symbol
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
  }
  value.data_ = (uint *)0x0;
  value.size_ = 0;
  value.allocated_size_ = 0;
  element_size = 0;
  read_variable_element_(this,&value,&element_size);
  if (bVar1) {
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    while( true ) {
      bVar1 = TextReader::is_symbol
                        ((TextReader *)
                         ((long)&this->_vptr_VariableTextReader +
                         (long)this->_vptr_VariableTextReader[-3]),',');
      this_00 = (TextReader *)
                ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]);
      if (!bVar1) break;
      TextReader::skip_symbol(this_00);
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      read_variable_element_(this,&value,&element_size);
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
    }
    TextReader::read_symbol(this_00,'}');
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
  }
  read_variable_elements_sequence_(this,&value,value.size_);
  VariablesArray::VariablesArray
            (__return_storage_ptr__,value.size_ / element_size,element_size,value.data_);
  Container<unsigned_int>::~Container(&value);
  return __return_storage_ptr__;
}

Assistant:

VariablesArray VariableTextReader::read_variable_value() {
        bool is_value_bracket = false;
        if (is_symbol('{')) {
            skip_symbol();
            skip_space();
            is_value_bracket = true;
        };
        
        Container<literalid_t> value;

        // the first element
        variableid_t element_size = 0;
        read_variable_element_(value, element_size);
        
        if (is_value_bracket) {
            // read more elements
            skip_space();
            while (is_symbol(',')) {
                skip_symbol();
                skip_space();
                read_variable_element_(value, element_size);
                skip_space();
            };
            
            read_symbol('}');
            skip_space();
        };
        
        read_variable_elements_sequence_(value, value.size_);
        
        return VariablesArray(value.size_ / element_size, element_size, value.data_);
    }